

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

nullres nullcBuildWithModuleName(char *code,char *moduleName)

{
  long lVar1;
  nullres nVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *bytecode;
  TraceScope traceScope;
  char *local_30;
  TraceScope local_28;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    nVar2 = '\0';
  }
  else {
    if (nullcBuildWithModuleName::token == '\0') {
      iVar5 = __cxa_guard_acquire(&nullcBuildWithModuleName::token);
      if (iVar5 != 0) {
        nullcBuildWithModuleName::token = NULLC::TraceGetToken("nullc","nullcBuild");
        __cxa_guard_release(&nullcBuildWithModuleName::token);
      }
    }
    NULLC::TraceScope::TraceScope(&local_28,nullcBuildWithModuleName::token);
    uVar3 = NULLCTime::clockMicro();
    nVar2 = nullcCompileWithModuleRoot(code,(char *)0x0);
    lVar1 = NULLC::compilerCtx;
    if (nVar2 == '\0') {
      nVar2 = '\0';
    }
    else {
      uVar4 = NULLCTime::clockMicro();
      *(uint *)(lVar1 + 0xa5b0) = uVar4;
      *(undefined4 *)(lVar1 + 0xa5b4) = 0;
      local_30 = (char *)0x0;
      nullcGetBytecode(&local_30);
      lVar1 = NULLC::compilerCtx;
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Finish((CompilerStatistics *)(lVar1 + 0xa5b0),"Bytecode",uVar4);
      lVar1 = NULLC::compilerCtx;
      if (*(char *)(NULLC::compilerCtx + 0xa5a8) == '\x01') {
        uVar4 = NULLCTime::clockMicro();
        OutputCompilerStatistics((CompilerStatistics *)(lVar1 + 0xa5b0),uVar4 - uVar3);
      }
      nullcClean();
      nVar2 = nullcLinkCodeWithModuleName(local_30,moduleName);
      if (local_30 != (char *)0x0) {
        operator_delete__(local_30);
      }
    }
    NULLC::TraceScope::~TraceScope(&local_28);
  }
  return nVar2;
}

Assistant:

nullres nullcBuildWithModuleName(const char* code, const char* moduleName)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcBuild");

	using namespace NULLC;

	unsigned start = NULLCTime::clockMicro();

	if(!nullcCompile(code))
		return false;

	compilerCtx->statistics.Start(NULLCTime::clockMicro());

	char *bytecode = NULL;
	nullcGetBytecode(&bytecode);

	compilerCtx->statistics.Finish("Bytecode", NULLCTime::clockMicro());

	if(compilerCtx->enableLogFiles)
	{
		OutputCompilerStatistics(compilerCtx->statistics, NULLCTime::clockMicro() - start);
	}

	nullcClean();

	if(!nullcLinkCodeWithModuleName(bytecode, moduleName))
	{
		delete[] bytecode;
		return false;
	}

	delete[] bytecode;
	return true;
}